

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O2

int Fra_FraigCec(Aig_Man_t **ppAig,int nConfLimit,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Aig_Man_t *pMan;
  Aig_Man_t *pAVar4;
  Aig_Man_t *p;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  Fra_Par_t Params;
  
  pAVar4 = *ppAig;
  if (fVerbose != 0) {
    printf("Original miter:   Nodes = %6d.\n",(ulong)(uint)(pAVar4->nObjs[6] + pAVar4->nObjs[5]));
  }
  iVar1 = Fra_FraigMiterStatus(pAVar4);
  if (iVar1 == 0) {
    pvVar5 = calloc(1,(long)pAVar4->nObjs[2] << 2);
    pAVar4->pData = pvVar5;
    iVar1 = 0;
  }
  else {
    aVar2 = Abc_Clock();
    iVar1 = Fra_FraigSat(pAVar4,600,0,0,0,0,1,0,0,0);
    if (fVerbose != 0) {
      iVar6 = 0x7da0ab;
      printf("Initial SAT:      Nodes = %6d.  ",(ulong)(uint)(pAVar4->nObjs[6] + pAVar4->nObjs[5]));
      Abc_Print(iVar6,"%s =","Time");
      aVar3 = Abc_Clock();
      Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
    }
    if (iVar1 < 0) {
      aVar2 = Abc_Clock();
      pMan = Dar_ManRwsat(pAVar4,1,0);
      Aig_ManStop(pAVar4);
      if (fVerbose != 0) {
        iVar1 = 0x7da0cc;
        printf("Rewriting:        Nodes = %6d.  ",(ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]));
        Abc_Print(iVar1,"%s =","Time");
        aVar3 = Abc_Clock();
        Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
      }
      Fra_ParamsDefault(&Params);
      Params.nBTLimitNode = 2;
      Params.nBTLimitMiter = 300;
      Params.fProve = 1;
      iVar1 = -1;
      Params.fDontShowBar = Params.fProve;
      for (uVar7 = 1; uVar7 != 7; uVar7 = uVar7 + 1) {
        iVar1 = Aig_ManCountXors(pMan);
        pAVar4 = pMan;
        if (pMan->nObjs[5] + pMan->nObjs[6] + 300 < iVar1 * 0x1e) {
          aVar2 = Abc_Clock();
          pAVar4 = Dar_ManBalanceXor(pMan,1,0,0);
          Aig_ManStop(pMan);
          if (fVerbose != 0) {
            iVar1 = 0x7da0ed;
            printf("Balance-X:        Nodes = %6d.  ",
                   (ulong)(uint)(pAVar4->nObjs[6] + pAVar4->nObjs[5]));
            Abc_Print(iVar1,"%s =","Time");
            aVar3 = Abc_Clock();
            Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
          }
        }
        aVar2 = Abc_Clock();
        p = Fra_FraigPerform(pAVar4,&Params);
        Aig_ManStop(pAVar4);
        if (fVerbose != 0) {
          iVar1 = 0x7da10e;
          printf("Fraiging (i=%d):   Nodes = %6d.  ",(ulong)uVar7,
                 (ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
          Abc_Print(iVar1,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
        iVar1 = Fra_FraigMiterStatus(p);
        pMan = p;
        if (-1 < iVar1) goto LAB_004f2600;
        aVar2 = Abc_Clock();
        pMan = Dar_ManRewriteDefault(p);
        Aig_ManStop(p);
        if (fVerbose != 0) {
          iVar1 = 0x7da0cc;
          printf("Rewriting:        Nodes = %6d.  ",(ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]));
          Abc_Print(iVar1,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
        iVar1 = Fra_FraigMiterStatus(pMan);
        if (-1 < iVar1) goto LAB_004f2600;
        Params.nBTLimitMiter = Params.nBTLimitMiter << 1;
        Params.nBTLimitNode = Params.nBTLimitNode << 3;
      }
      if (iVar1 == -1) {
        aVar2 = Abc_Clock();
        iVar1 = Fra_FraigSat(pMan,(long)nConfLimit,0,0,0,0,1,0,0,0);
        if (fVerbose != 0) {
          iVar6 = 0x7da130;
          printf("Final SAT:        Nodes = %6d.  ",(ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]));
          Abc_Print(iVar6,"%s =","Time");
          aVar3 = Abc_Clock();
          Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
        }
      }
LAB_004f2600:
      *ppAig = pMan;
    }
  }
  return iVar1;
}

Assistant:

int Fra_FraigCec( Aig_Man_t ** ppAig, int nConfLimit, int fVerbose )
{
    int nBTLimitStart =        300;   // starting SAT run
    int nBTLimitFirst =          2;   // first fraiging iteration
    int nBTLimitLast  = nConfLimit;   // the last-gasp SAT run

    Fra_Par_t Params, * pParams = &Params;
    Aig_Man_t * pAig = *ppAig, * pTemp;
    int i, RetValue;
    abctime clk;

    // report the original miter
    if ( fVerbose )
    {
        printf( "Original miter:   Nodes = %6d.\n", Aig_ManNodeNum(pAig) );
    }
    RetValue = Fra_FraigMiterStatus( pAig );
//    assert( RetValue == -1 );
    if ( RetValue == 0 )
    {
        pAig->pData = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
        memset( pAig->pData, 0, sizeof(int) * Aig_ManCiNum(pAig) );
        return RetValue;
    }

    // if SAT only, solve without iteration
clk = Abc_Clock();
    RetValue = Fra_FraigSat( pAig, (ABC_INT64_T)2*nBTLimitStart, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
    if ( fVerbose )
    {
        printf( "Initial SAT:      Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }
    if ( RetValue >= 0 )
        return RetValue;

    // duplicate the AIG
clk = Abc_Clock();
    pAig = Dar_ManRwsat( pTemp = pAig, 1, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose )
    {
        printf( "Rewriting:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // perform the loop
    Fra_ParamsDefault( pParams );
    pParams->nBTLimitNode = nBTLimitFirst;
    pParams->nBTLimitMiter = nBTLimitStart;
    pParams->fDontShowBar = 1;
    pParams->fProve = 1;
    for ( i = 0; i < 6; i++ )
    {
//printf( "Running fraiging with %d BTnode and %d BTmiter.\n", pParams->nBTLimitNode, pParams->nBTLimitMiter );
        // try XOR balancing
        if ( Aig_ManCountXors(pAig) * 30 > Aig_ManNodeNum(pAig) + 300 )
        {
clk = Abc_Clock();
            pAig = Dar_ManBalanceXor( pTemp = pAig, 1, 0, 0 );
            Aig_ManStop( pTemp );
            if ( fVerbose )
            {
                printf( "Balance-X:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
            } 
        }

        // run fraiging
clk = Abc_Clock();
        pAig = Fra_FraigPerform( pTemp = pAig, pParams );
        Aig_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Fraiging (i=%d):   Nodes = %6d.  ", i+1, Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        }

        // check the miter status
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue >= 0 )
            break;

        // perform rewriting
clk = Abc_Clock();
        pAig = Dar_ManRewriteDefault( pTemp = pAig );
        Aig_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Rewriting:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        } 

        // check the miter status
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue >= 0 )
            break;
        // try simulation

        // set the parameters for the next run
        pParams->nBTLimitNode = 8 * pParams->nBTLimitNode;
        pParams->nBTLimitMiter = 2 * pParams->nBTLimitMiter;
    }

    // if still unsolved try last gasp
    if ( RetValue == -1 )
    {
clk = Abc_Clock();
        RetValue = Fra_FraigSat( pAig, (ABC_INT64_T)nBTLimitLast, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Final SAT:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }

    *ppAig = pAig;
    return RetValue;
}